

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_positional_scan.cpp
# Opt level: O2

SourceResultType __thiscall
duckdb::PhysicalPositionalScan::GetData
          (PhysicalPositionalScan *this,ExecutionContext *context,DataChunk *output,
          OperatorSourceInput *input)

{
  LocalSourceState *pLVar1;
  unique_ptr<duckdb::PositionalTableScanner,_std::default_delete<duckdb::PositionalTableScanner>,_true>
  *puVar2;
  SourceResultType SVar3;
  pointer pPVar4;
  idx_t iVar5;
  idx_t iVar6;
  unique_ptr<duckdb::PositionalTableScanner,_std::default_delete<duckdb::PositionalTableScanner>,_true>
  *scanner;
  unique_ptr<duckdb::PositionalTableScanner,_std::default_delete<duckdb::PositionalTableScanner>,_true>
  *puVar7;
  ulong count;
  
  pLVar1 = input->local_state;
  puVar2 = (unique_ptr<duckdb::PositionalTableScanner,_std::default_delete<duckdb::PositionalTableScanner>,_true>
            *)pLVar1[2]._vptr_LocalSourceState;
  count = 0;
  for (puVar7 = (unique_ptr<duckdb::PositionalTableScanner,_std::default_delete<duckdb::PositionalTableScanner>,_true>
                 *)pLVar1[1]._vptr_LocalSourceState; puVar7 != puVar2; puVar7 = puVar7 + 1) {
    pPVar4 = unique_ptr<duckdb::PositionalTableScanner,_std::default_delete<duckdb::PositionalTableScanner>,_true>
             ::operator->(puVar7);
    iVar5 = PositionalTableScanner::Refill(pPVar4,context);
    if (count <= iVar5) {
      count = iVar5;
    }
  }
  if (count == 0) {
    SVar3 = FINISHED;
  }
  else {
    puVar2 = (unique_ptr<duckdb::PositionalTableScanner,_std::default_delete<duckdb::PositionalTableScanner>,_true>
              *)pLVar1[2]._vptr_LocalSourceState;
    iVar5 = 0;
    for (puVar7 = (unique_ptr<duckdb::PositionalTableScanner,_std::default_delete<duckdb::PositionalTableScanner>,_true>
                   *)pLVar1[1]._vptr_LocalSourceState; puVar7 != puVar2; puVar7 = puVar7 + 1) {
      pPVar4 = unique_ptr<duckdb::PositionalTableScanner,_std::default_delete<duckdb::PositionalTableScanner>,_true>
               ::operator->(puVar7);
      iVar6 = PositionalTableScanner::CopyData(pPVar4,context,output,count,iVar5);
      iVar5 = iVar5 + iVar6;
    }
    output->count = count;
    SVar3 = HAVE_MORE_OUTPUT;
  }
  return SVar3;
}

Assistant:

SourceResultType PhysicalPositionalScan::GetData(ExecutionContext &context, DataChunk &output,
                                                 OperatorSourceInput &input) const {
	auto &lstate = input.local_state.Cast<PositionalScanLocalSourceState>();

	// Find the longest source block
	idx_t count = 0;
	for (auto &scanner : lstate.scanners) {
		count = MaxValue(count, scanner->Refill(context));
	}

	//	All done?
	if (!count) {
		return SourceResultType::FINISHED;
	}

	// Copy or reference the source columns
	idx_t col_offset = 0;
	for (auto &scanner : lstate.scanners) {
		col_offset += scanner->CopyData(context, output, count, col_offset);
	}

	output.SetCardinality(count);
	return SourceResultType::HAVE_MORE_OUTPUT;
}